

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<JumpCleanupInfo,_RealCount>::RemoveHead<Memory::ArenaAllocator>
          (DListBase<JumpCleanupInfo,_RealCount> *this,ArenaAllocator *allocator)

{
  DListNodeBase<JumpCleanupInfo> *buffer;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((DListBase<JumpCleanupInfo,_RealCount> *)
      (this->super_DListNodeBase<JumpCleanupInfo>).next.base == this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x158,"(!this->Empty())","!this->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  buffer = (this->super_DListNodeBase<JumpCleanupInfo>).next.base;
  ((buffer->prev).base)->next = buffer->next;
  ((buffer->next).base)->prev = buffer->prev;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x30);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveHead(TAllocator * allocator)
    {
        Assert(!this->Empty());

        NodeBase * node = this->Next();
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, (Node *)node);

        this->DecrementCount();
    }